

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codebook.c
# Opt level: O2

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,oggpack_buffer *b,int n)

{
  long lVar1;
  float *pfVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  int iVar7;
  int iVar8;
  
  if (0 < book->used_entries) {
    lVar3 = offset / (long)ch;
    lVar6 = (long)(int)((n + offset) / (long)ch);
    iVar7 = 0;
    while (lVar3 < lVar6) {
      lVar4 = decode_packed_entry_number(book,b);
      if (lVar4 == -1) {
        return -1;
      }
      lVar1 = book->dim;
      pfVar2 = book->valuelist;
      for (lVar5 = 0; (lVar3 < lVar6 && (lVar5 < lVar1)); lVar5 = lVar5 + 1) {
        iVar8 = iVar7 + 1;
        a[iVar7][lVar3] = pfVar2[lVar4 * lVar1 + lVar5] + a[iVar7][lVar3];
        iVar7 = iVar8;
        if (iVar8 == ch) {
          iVar7 = 0;
        }
        lVar3 = lVar3 + (ulong)(iVar8 == ch);
      }
    }
  }
  return 0;
}

Assistant:

long vorbis_book_decodevv_add(codebook *book,float **a,long offset,int ch,
                              oggpack_buffer *b,int n){

  long i,j,entry;
  int chptr=0;
  if(book->used_entries>0){
    int m=(offset+n)/ch;
    for(i=offset/ch;i<m;){
      entry = decode_packed_entry_number(book,b);
      if(entry==-1)return(-1);
      {
        const float *t = book->valuelist+entry*book->dim;
        for (j=0;i<m && j<book->dim;j++){
          a[chptr++][i]+=t[j];
          if(chptr==ch){
            chptr=0;
            i++;
          }
        }
      }
    }
  }
  return(0);
}